

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module_instrumentation.cpp
# Opt level: O0

Id dxil_spv::build_assume_true_call_function
             (SPIRVModule *module,InstructionInstrumentationState *instrumentation)

{
  initializer_list<unsigned_int> __l;
  Block *pBVar1;
  Builder *instrumentation_00;
  InstructionInstrumentationState *module_00;
  Id IVar2;
  Function *pFVar3;
  Block *this;
  __uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true> this_00;
  pointer pIVar4;
  pointer pIVar5;
  size_t sVar6;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_f0;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_e8;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_e0;
  Id local_d4;
  undefined4 local_d0;
  Id cond_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_c8;
  __single_object will_report;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_b8;
  __single_object loaded;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_a8;
  __single_object should_report;
  Block *fail_block;
  Block *merge_block;
  allocator_type local_71;
  Id local_70;
  Id local_6c;
  iterator local_68;
  undefined8 local_60;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_58;
  Function *local_40;
  Function *func;
  Id u32_type;
  Id bool_type;
  Block *entry;
  Block *current_build_point;
  Builder *builder;
  InstructionInstrumentationState *instrumentation_local;
  SPIRVModule *module_local;
  
  builder = (Builder *)instrumentation;
  instrumentation_local = (InstructionInstrumentationState *)module;
  current_build_point = (Block *)SPIRVModule::get_builder(module);
  entry = spv::Builder::getBuildPoint((Builder *)current_build_point);
  _u32_type = (Block *)0x0;
  func._4_4_ = spv::Builder::makeBoolType((Builder *)current_build_point);
  func._0_4_ = spv::Builder::makeUintType((Builder *)current_build_point,0x20);
  pBVar1 = current_build_point;
  IVar2 = spv::Builder::makeVoidType((Builder *)current_build_point);
  local_70 = func._4_4_;
  local_6c = (Id)func;
  local_68 = &local_70;
  local_60 = 2;
  __l._M_len = 2;
  __l._M_array = local_68;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
            (&local_58,__l,&local_71);
  memset(&merge_block,0,0x18);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
            *)&merge_block);
  pFVar3 = spv::Builder::makeFunctionEntry
                     ((Builder *)pBVar1,DecorationMax,IVar2,"AssumeTrue",&local_58,
                      (Vector<dxil_spv::Vector<Decoration>_> *)&merge_block,(Block **)&u32_type);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             *)&merge_block);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_58);
  pBVar1 = current_build_point;
  local_40 = pFVar3;
  IVar2 = spv::Function::getParamId(pFVar3,0);
  spv::Builder::addName((Builder *)pBVar1,IVar2,"value");
  pBVar1 = current_build_point;
  IVar2 = spv::Function::getParamId(local_40,1);
  sVar6 = (size_t)IVar2;
  spv::Builder::addName((Builder *)pBVar1,IVar2,"inst");
  this = (Block *)spv::Block::operator_new((Block *)0x78,sVar6);
  IVar2 = spv::Builder::getUniqueId((Builder *)current_build_point);
  sVar6 = (size_t)IVar2;
  spv::Block::Block(this,IVar2,local_40);
  this_00.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)
       spv::Block::operator_new((Block *)0x78,sVar6);
  IVar2 = spv::Builder::getUniqueId((Builder *)current_build_point);
  spv::Block::Block((Block *)this_00.
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                             .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,IVar2,
                    local_40);
  should_report._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
  ._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
       (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
       this_00.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  loaded._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
       spv::Builder::getUniqueId((Builder *)current_build_point);
  loaded._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0xa8;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_a8,
             (uint *)((long)&loaded._M_t.
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                             .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
             (Op *)((long)&func + 4));
  pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_a8);
  IVar2 = spv::Function::getParamId(local_40,0);
  spv::Instruction::addIdOperand(pIVar4,IVar2);
  will_report._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
  _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
       spv::Builder::getUniqueId((Builder *)current_build_point);
  will_report._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
  _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x3d;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_b8,
             (uint *)((long)&will_report._M_t.
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                             .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
             (Op *)((long)&func + 4));
  pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_b8);
  spv::Instruction::addIdOperand(pIVar4,*(Id *)&builder->field_0x14);
  cond_id = spv::Builder::getUniqueId((Builder *)current_build_point);
  local_d0 = 0xa7;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_c8,&cond_id,(Op *)((long)&func + 4));
  pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_c8);
  pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_a8);
  IVar2 = spv::Instruction::getResultId(pIVar5);
  spv::Instruction::addIdOperand(pIVar4,IVar2);
  pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_c8);
  pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_b8);
  IVar2 = spv::Instruction::getResultId(pIVar5);
  spv::Instruction::addIdOperand(pIVar4,IVar2);
  pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_c8);
  local_d4 = spv::Instruction::getResultId(pIVar4);
  pBVar1 = _u32_type;
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_e0,&local_a8);
  spv::Block::addInstruction(pBVar1,&local_e0);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_e0);
  pBVar1 = _u32_type;
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_e8,&local_b8);
  spv::Block::addInstruction(pBVar1,&local_e8);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_e8);
  pBVar1 = _u32_type;
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_f0,&local_c8);
  spv::Block::addInstruction(pBVar1,&local_f0);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_f0);
  spv::Builder::createSelectionMerge((Builder *)current_build_point,this,0);
  spv::Builder::createConditionalBranch
            ((Builder *)current_build_point,local_d4,
             (Block *)should_report._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,this);
  spv::Builder::setBuildPoint
            ((Builder *)current_build_point,
             (Block *)should_report._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  module_00 = instrumentation_local;
  instrumentation_00 = builder;
  pFVar3 = local_40;
  IVar2 = spv::Function::getParamId(local_40,1);
  emit_instrumentation_hash
            ((SPIRVModule *)module_00,(InstructionInstrumentationState *)instrumentation_00,pFVar3,0
             ,IVar2);
  spv::Builder::createBranch((Builder *)current_build_point,this);
  spv::Builder::setBuildPoint((Builder *)current_build_point,this);
  spv::Builder::makeReturn((Builder *)current_build_point,false,0);
  spv::Builder::setBuildPoint((Builder *)current_build_point,entry);
  IVar2 = spv::Function::getId(local_40);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_c8);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_b8);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_a8);
  return IVar2;
}

Assistant:

spv::Id build_assume_true_call_function(SPIRVModule &module, const InstructionInstrumentationState &instrumentation)
{
	auto &builder = module.get_builder();

	// Use normal bb->addInstruction here since we don't want to instrument the code that is doing instrumentation :')
	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id bool_type = builder.makeBoolType();
	spv::Id u32_type = builder.makeUintType(32);

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, builder.makeVoidType(),
	                                       "AssumeTrue",
	                                       { bool_type, u32_type }, {}, &entry);

	builder.addName(func->getParamId(0), "value");
	builder.addName(func->getParamId(1), "inst");

	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);
	auto *fail_block = new spv::Block(builder.getUniqueId(), *func);

	auto should_report = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpLogicalNot);
	should_report->addIdOperand(func->getParamId(0));

	auto loaded = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpLoad);
	loaded->addIdOperand(instrumentation.should_report_instrumentation_id);

	auto will_report = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpLogicalAnd);
	will_report->addIdOperand(should_report->getResultId());
	will_report->addIdOperand(loaded->getResultId());

	spv::Id cond_id = will_report->getResultId();

	entry->addInstruction(std::move(should_report));
	entry->addInstruction(std::move(loaded));
	entry->addInstruction(std::move(will_report));

	builder.createSelectionMerge(merge_block, 0);
	builder.createConditionalBranch(cond_id, fail_block, merge_block);

	builder.setBuildPoint(fail_block);
	{
		// Dummy value is stored.
		emit_instrumentation_hash(module, instrumentation, func, 0, func->getParamId(1));
		builder.createBranch(merge_block);
	}

	builder.setBuildPoint(merge_block);
	builder.makeReturn(false);
	builder.setBuildPoint(current_build_point);
	return func->getId();
}